

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

void __thiscall
icu_63::DayPeriodRulesDataSink::setDayPeriodForHoursFromCutoffs
          (DayPeriodRulesDataSink *this,UErrorCode *errorCode)

{
  DayPeriodRules *this_00;
  int local_28;
  int local_24;
  int32_t hour;
  int32_t startHour;
  DayPeriodRules *rule;
  UErrorCode *errorCode_local;
  DayPeriodRulesDataSink *this_local;
  
  this_00 = (DayPeriodRules *)
            (*(long *)((anonymous_namespace)::data + 8) + (long)this->ruleSetNum * 100);
  local_24 = 0;
  do {
    if (0x18 < local_24) {
      return;
    }
    if ((this->cutoffs[local_24] & 8U) != 0) {
      if ((local_24 == 0) && (this->period == DAYPERIOD_MIDNIGHT)) {
        this_00->fHasMidnight = '\x01';
      }
      else {
        if ((local_24 != 0xc) || (this->period != DAYPERIOD_NOON)) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          return;
        }
        this_00->fHasNoon = '\x01';
      }
    }
    local_28 = local_24;
    if (((this->cutoffs[local_24] & 4U) != 0) || ((this->cutoffs[local_24] & 2U) != 0)) {
      do {
        local_28 = local_28 + 1;
        if (local_28 == local_24) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          return;
        }
        if (local_28 == 0x19) {
          local_28 = 0;
        }
      } while ((this->cutoffs[local_28] & 1U) == 0);
      DayPeriodRules::add(this_00,local_24,local_28,this->period);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void setDayPeriodForHoursFromCutoffs(UErrorCode &errorCode) {
        DayPeriodRules &rule = data->rules[ruleSetNum];

        for (int32_t startHour = 0; startHour <= 24; ++startHour) {
            // AT cutoffs must be either midnight or noon.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_AT)) {
                if (startHour == 0 && period == DayPeriodRules::DAYPERIOD_MIDNIGHT) {
                    rule.fHasMidnight = TRUE;
                } else if (startHour == 12 && period == DayPeriodRules::DAYPERIOD_NOON) {
                    rule.fHasNoon = TRUE;
                } else {
                    errorCode = U_INVALID_FORMAT_ERROR;  // Bad data.
                    return;
                }
            }

            // FROM/AFTER and BEFORE must come in a pair.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_FROM) ||
                    cutoffs[startHour] & (1 << CUTOFF_TYPE_AFTER)) {
                for (int32_t hour = startHour + 1;; ++hour) {
                    if (hour == startHour) {
                        // We've gone around the array once and can't find a BEFORE.
                        errorCode = U_INVALID_FORMAT_ERROR;
                        return;
                    }
                    if (hour == 25) { hour = 0; }
                    if (cutoffs[hour] & (1 << CUTOFF_TYPE_BEFORE)) {
                        rule.add(startHour, hour, period);
                        break;
                    }
                }
            }
        }
    }